

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O2

int av1_get_pred_context_single_ref_p6(MACROBLOCKD *xd)

{
  int iVar1;
  
  iVar1 = 1;
  if (xd->neighbors_ref_counts[5] != xd->neighbors_ref_counts[6]) {
    iVar1 = (uint)(xd->neighbors_ref_counts[6] <= xd->neighbors_ref_counts[5]) * 2;
  }
  return iVar1;
}

Assistant:

static int get_pred_context_brf_or_arf2(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of BWDREF frames (B)
  const int brf_count = ref_counts[BWDREF_FRAME];
  // Count of ALTREF2 frames (A2)
  const int arf2_count = ref_counts[ALTREF2_FRAME];

  const int pred_context =
      (brf_count == arf2_count) ? 1 : ((brf_count < arf2_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}